

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O2

apx_error_t
apx_program_encode_header
          (apx_program_t *program,apx_programType_t program_type,uint32_t element_size,
          uint32_t queue_size,_Bool is_dynamic)

{
  byte bVar1;
  char cVar2;
  uint8_t u8Size;
  apx_error_t aVar3;
  uint32_t uVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  uint value;
  ulong uVar9;
  uint8_t encoded_size [4];
  
  encoded_size[0] = '\0';
  encoded_size[1] = '\0';
  encoded_size[2] = '\0';
  encoded_size[3] = '\0';
  if (queue_size == 0) {
    bVar7 = 0;
    cVar5 = '\0';
    uVar9 = (ulong)element_size;
  }
  else {
    cVar5 = '\x02' - (queue_size < 0x10000);
    bVar7 = 2 - (element_size < 0x10000);
    if (element_size < 0x100) {
      bVar7 = 0;
    }
    if (queue_size < 0x100) {
      cVar5 = '\0';
    }
    lVar8 = 1;
    if (queue_size >= 0x100) {
      lVar8 = (ulong)(0xfeff < queue_size - 0x100) * 2 + 2;
    }
    uVar9 = (ulong)queue_size * (ulong)element_size + lVar8;
    if (uVar9 >> 0x20 != 0) {
      return 7;
    }
  }
  value = (uint)uVar9;
  bVar6 = 2 - (value < 0x10000);
  u8Size = (value >= 0x10000) * '\x02' + '\x02';
  if (value < 0x100) {
    u8Size = '\x01';
    bVar6 = 0;
  }
  packLE(encoded_size,value,u8Size);
  bVar6 = (program_type == '\x01') << 3 | bVar6;
  bVar1 = bVar6 | 0x10;
  if (!is_dynamic) {
    bVar1 = bVar6;
  }
  bVar6 = bVar1 | 0x20;
  if (queue_size == 0) {
    bVar6 = bVar1;
  }
  cVar2 = adt_bytearray_push(program,bVar6);
  if (cVar2 == '\0') {
    uVar4 = (0xffff < value) + 2 + (uint)(0xffff < value);
    if (value < 0x100) {
      uVar4 = 1;
    }
    cVar2 = adt_bytearray_append(program,encoded_size,uVar4);
    if ((queue_size != 0) && (cVar2 == '\0')) {
      cVar2 = '\x03';
      if (bVar7 != 0) {
        cVar2 = (bVar7 != 1) * '\x03' + '\x06';
      }
      cVar2 = adt_bytearray_push(program,(cVar2 + cVar5) * '\b' | 2);
      if (cVar2 == '\0') {
        uVar4 = *(uint32_t *)(&DAT_00143290 + (long)(char)bVar7 * 4);
        packLE(encoded_size,element_size,(uint8_t)(0x40201 >> ((bVar7 & 3) << 3)));
        cVar2 = adt_bytearray_append(program,encoded_size,uVar4);
      }
    }
  }
  aVar3 = 0;
  if (cVar2 != '\0') {
    aVar3 = (uint)(cVar2 != '\x02') * 4 + 2;
  }
  return aVar3;
}

Assistant:

apx_error_t apx_program_encode_header(apx_program_t* program, apx_programType_t program_type, uint32_t element_size, uint32_t queue_size, bool is_dynamic)
{
   adt_error_t rc = ADT_NO_ERROR;
   uint8_t encoded_size[APX_VM_UINT32_SIZE] = { 0u, 0u, 0u, 0u };
   uint8_t data_size_variant = 0u;
   uint32_t packed_size = 0u;
   uint32_t data_size = 0u;
   uint8_t queue_variant = 0u; //Only used when is_queued is true
   uint8_t element_variant = 0u; //Only used when is_queued is true
   uint8_t program_byte = 0u;
   uint8_t* p = &encoded_size[0];
   bool const is_queued = queue_size > 0u;

   if (is_queued)
   {
      queue_variant = (queue_size <= UINT8_MAX) ? APX_VM_VARIANT_UINT8 : (queue_size <= UINT16_MAX) ? APX_VM_VARIANT_UINT16 : APX_VM_VARIANT_UINT32;
      element_variant = (element_size <= UINT8_MAX) ? APX_VM_VARIANT_UINT8 : (element_size <= UINT16_MAX) ? APX_VM_VARIANT_UINT16 : APX_VM_VARIANT_UINT32;
      uint32_t const queue_length_size = (queue_variant == APX_VM_VARIANT_UINT8) ? UINT8_SIZE : (queue_variant == APX_VM_VARIANT_UINT16) ? UINT16_SIZE : UINT32_SIZE;
      uint64_t const tmp = queue_length_size + (((uint64_t)element_size) * queue_size);
      if (tmp > UINT32_MAX)
      {
         return APX_LENGTH_ERROR;
      }
      data_size = (uint32_t)tmp;
   }
   else
   {
      data_size = element_size;
   }

   //determine value of data_size_variant
   if (data_size <= UINT8_MAX)
   {
      data_size_variant = APX_VM_VARIANT_UINT8;
      packLE(p, data_size, (uint8_t)UINT8_SIZE);
      p += UINT8_SIZE;
   }
   else if (data_size <= UINT16_MAX)
   {
      data_size_variant = APX_VM_VARIANT_UINT16;
      packLE(p, data_size, (uint8_t)UINT16_SIZE);
      p += UINT16_SIZE;
   }
   else
   {
      data_size_variant = APX_VM_VARIANT_UINT32;
      packLE(p, data_size, (uint8_t)UINT32_SIZE);
      p += UINT32_SIZE;
   }
   packed_size = (uint32_t)(p - &encoded_size[0]);
   assert((packed_size > 0) && (packed_size <= UINT32_SIZE));

   program_byte = encode_program_byte(program_type, is_dynamic, is_queued, data_size_variant);
   rc = adt_bytearray_push(program, program_byte);
   if (rc == ADT_NO_ERROR)
   {
      rc = adt_bytearray_append(program, &encoded_size[0], packed_size);
   }
   if ((rc == ADT_NO_ERROR) && is_queued)
   {
      uint8_t const opcode = APX_VM_OPCODE_DATA_SIZE;
      uint8_t const variant = calc_data_size_variant(element_variant, queue_variant);
      uint8_t const instruction = apx_program_encode_instruction(opcode, variant, false);
      rc = adt_bytearray_push(program, instruction);
      if (rc == ADT_NO_ERROR)
      {
         p = &encoded_size[0];
         switch (element_variant)
         {
         case APX_VM_VARIANT_UINT8:
            packLE(p, element_size, (uint8_t)UINT8_SIZE);
            p += UINT8_SIZE;
            break;
         case APX_VM_VARIANT_UINT16:
            packLE(p, element_size, (uint8_t)UINT16_SIZE);
            p += UINT16_SIZE;
            break;
         case APX_VM_VARIANT_UINT32:
            packLE(p, element_size, (uint8_t)UINT32_SIZE);
            p += UINT32_SIZE;
            break;
         default:
            assert(0);
            return APX_VALUE_TYPE_ERROR;
         }
         packed_size = (uint32_t)(p - &encoded_size[0]);
         assert((packed_size > 0) && (packed_size <= UINT32_SIZE));
         rc = adt_bytearray_append(program, &encoded_size[0], packed_size);
      }
   }

   if (rc != ADT_NO_ERROR)
   {
      if (rc == ADT_MEM_ERROR)
      {
         return APX_MEM_ERROR;
      }
      else
      {
         return APX_INTERNAL_ERROR;
      }
   }
   return APX_NO_ERROR;
}